

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFRAgent.cpp
# Opt level: O2

void __thiscall Agent::CFRAgent<Kuhn::Game>::~CFRAgent(CFRAgent<Kuhn::Game> *this)

{
  Node *this_00;
  __node_base *p_Var1;
  
  p_Var1 = &(this->mStrategy)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    this_00 = (Node *)p_Var1[5]._M_nxt;
    if (this_00 != (Node *)0x0) {
      Trainer::Node::~Node(this_00);
    }
    operator_delete(this_00,0x30);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->mStrategy)._M_h);
  return;
}

Assistant:

CFRAgent<T>::~CFRAgent() {
    for (auto &itr : mStrategy) {
        delete itr.second;
    }
}